

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

ostringstream * __thiscall clask::logger::get_abi_cxx11_(logger *this,log_level level)

{
  ostringstream *__os;
  tm *ptVar1;
  long lVar2;
  char *pcVar3;
  _Put_time<char> __f;
  time_t t;
  tm tm;
  time_t local_60;
  tm local_58;
  
  local_60 = time((time_t *)0x0);
  ptVar1 = localtime(&local_60);
  local_58.tm_sec = ptVar1->tm_sec;
  local_58.tm_min = ptVar1->tm_min;
  local_58.tm_hour = ptVar1->tm_hour;
  local_58.tm_mday = ptVar1->tm_mday;
  local_58.tm_mon = ptVar1->tm_mon;
  local_58.tm_year = ptVar1->tm_year;
  local_58.tm_wday = ptVar1->tm_wday;
  local_58.tm_yday = ptVar1->tm_yday;
  local_58.tm_isdst = ptVar1->tm_isdst;
  local_58._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_58.tm_gmtoff = ptVar1->tm_gmtoff;
  local_58.tm_zone = ptVar1->tm_zone;
  __os = &this->os;
  __f._M_fmt = "%Y/%m/%d %H:%M:%S ";
  __f._M_tmb = &local_58;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)__os,__f);
  switch(level) {
  case ERR:
    pcVar3 = "ERR: ";
    lVar2 = 5;
    break;
  case WARN:
    pcVar3 = "WARN: ";
    goto LAB_00120cbf;
  case INFO:
    pcVar3 = "INFO: ";
LAB_00120cbf:
    lVar2 = 6;
    break;
  case DEBUG:
    pcVar3 = "DEBUG: ";
    lVar2 = 7;
    break;
  default:
    goto switchD_00120c91_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)__os,pcVar3,lVar2);
switchD_00120c91_default:
  this->lv = level;
  return __os;
}

Assistant:

inline std::ostringstream& logger::get(log_level level) {
  auto t = std::time(nullptr);
  auto tm = *std::localtime(&t);
  os << std::put_time(&tm, "%Y/%m/%d %H:%M:%S ");
  switch (level) {
    case log_level::ERR: os << "ERR: "; break;
    case log_level::WARN: os << "WARN: "; break;
    case log_level::INFO: os << "INFO: "; break;
    case log_level::DEBUG: os << "DEBUG: "; break;
    default: break;
  }
  lv = level;
  return os;
}